

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImGuiOldColumns *pIVar1;
  ImGuiWindow *pIVar2;
  byte in_DL;
  int in_EDI;
  ImGuiOldColumns *columns;
  ImGuiOldColumnFlags flags;
  ImGuiWindow *window;
  ImGuiOldColumnFlags in_stack_00000058;
  int in_stack_0000005c;
  char *in_stack_00000060;
  
  pIVar2 = GetCurrentWindow();
  pIVar1 = (pIVar2->DC).CurrentColumns;
  if (((pIVar1 == (ImGuiOldColumns *)0x0) || (pIVar1->Count != in_EDI)) ||
     (pIVar1->Flags != (uint)((in_DL & 1) == 0))) {
    if (pIVar1 != (ImGuiOldColumns *)0x0) {
      EndColumns();
    }
    if (in_EDI != 1) {
      BeginColumns(in_stack_00000060,in_stack_0000005c,in_stack_00000058);
    }
  }
  return;
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    ImGuiOldColumnFlags flags = (border ? 0 : ImGuiOldColumnFlags_NoBorder);
    //flags |= ImGuiOldColumnFlags_NoPreserveWidths; // NB: Legacy behavior
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns != NULL && columns->Count == columns_count && columns->Flags == flags)
        return;

    if (columns != NULL)
        EndColumns();

    if (columns_count != 1)
        BeginColumns(id, columns_count, flags);
}